

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O0

bool __thiscall
ON_SectionStylePrivate::operator==(ON_SectionStylePrivate *this,ON_SectionStylePrivate *other)

{
  ON__UINT64 *pOVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  bool local_89;
  ON_ModelComponentContentMark local_80;
  ON_ModelComponentContentMark local_58;
  element_type *local_30;
  ON_Linetype *customOther;
  ON_Linetype *customThis;
  ON_SectionStylePrivate *other_local;
  ON_SectionStylePrivate *this_local;
  
  customThis = (ON_Linetype *)other;
  other_local = this;
  customOther = std::__shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>::get
                          (&(this->m_custom_linetype).
                            super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>);
  local_30 = std::__shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2> *)
                        &(customThis->super_ON_ModelComponent).m_component_id);
  if ((customOther == (ON_Linetype *)0x0) && (local_30 != (element_type *)0x0)) {
    this_local._7_1_ = false;
  }
  else if ((customOther == (ON_Linetype *)0x0) || (local_30 != (element_type *)0x0)) {
    if ((customOther != (ON_Linetype *)0x0) && (local_30 != (element_type *)0x0)) {
      ON_ModelComponentContentMark::ON_ModelComponentContentMark
                (&local_58,&customOther->super_ON_ModelComponent);
      ON_ModelComponentContentMark::ON_ModelComponentContentMark
                (&local_80,&local_30->super_ON_ModelComponent);
      bVar2 = ::operator!=(&local_58,&local_80);
      if (bVar2) {
        return false;
      }
    }
    local_89 = false;
    if (((this->m_background_fill_mode ==
          *(SectionBackgroundFillMode *)
           &(customThis->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object) &&
        (local_89 = false,
        this->m_fill_rule ==
        *(SectionFillRule *)
         ((long)&(customThis->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object + 1))) &&
       (local_89 = false,
       this->m_hatch_index ==
       *(int *)((long)&(customThis->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object + 4)))
    {
      pOVar1 = &(customThis->super_ON_ModelComponent).m_runtime_serial_number;
      local_89 = false;
      if ((this->m_hatch_rotation == (double)*pOVar1) &&
         (!NAN(this->m_hatch_rotation) && !NAN((double)*pOVar1))) {
        uVar3 = ON_Color::operator_cast_to_unsigned_int(&this->m_background_fill_color);
        uVar4 = ON_Color::operator_cast_to_unsigned_int
                          ((ON_Color *)
                           &(customThis->super_ON_ModelComponent).m_content_version_number);
        local_89 = false;
        if (uVar3 == uVar4) {
          uVar3 = ON_Color::operator_cast_to_unsigned_int(&this->m_background_fill_print_color);
          uVar4 = ON_Color::operator_cast_to_unsigned_int
                            ((ON_Color *)
                             ((long)&(customThis->super_ON_ModelComponent).m_content_version_number
                             + 4));
          local_89 = false;
          if (uVar3 == uVar4) {
            uVar3 = ON_Color::operator_cast_to_unsigned_int(&this->m_boundary_color);
            uVar4 = ON_Color::operator_cast_to_unsigned_int
                              ((ON_Color *)
                               &(customThis->super_ON_ModelComponent).m_model_serial_number);
            local_89 = false;
            if (uVar3 == uVar4) {
              uVar3 = ON_Color::operator_cast_to_unsigned_int(&this->m_boundary_print_color);
              uVar4 = ON_Color::operator_cast_to_unsigned_int
                                ((ON_Color *)
                                 &(customThis->super_ON_ModelComponent).
                                  m_reference_model_serial_number);
              local_89 = false;
              if (uVar3 == uVar4) {
                uVar3 = ON_Color::operator_cast_to_unsigned_int(&this->m_hatch_color);
                uVar4 = ON_Color::operator_cast_to_unsigned_int
                                  ((ON_Color *)
                                   &(customThis->super_ON_ModelComponent).
                                    m_linked_idef_serial_number);
                local_89 = false;
                if (uVar3 == uVar4) {
                  uVar3 = ON_Color::operator_cast_to_unsigned_int(&this->m_hatch_print_color);
                  uVar4 = ON_Color::operator_cast_to_unsigned_int
                                    ((ON_Color *)
                                     &(customThis->super_ON_ModelComponent).m_component_type);
                  local_89 = false;
                  if ((uVar3 == uVar4) &&
                     (local_89 = false,
                     (this->m_boundary_visible & 1U) ==
                     ((byte)(customThis->super_ON_ModelComponent).m_set_status & 1))) {
                    local_89 = this->m_boundary_width_scale ==
                               *(double *)&(customThis->super_ON_ModelComponent).m_component_index;
                  }
                }
              }
            }
          }
        }
      }
    }
    this_local._7_1_ = local_89;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SectionStylePrivate::operator==(const ON_SectionStylePrivate& other) const
{
  {
    const ON_Linetype* customThis = m_custom_linetype.get();
    const ON_Linetype* customOther = other.m_custom_linetype.get();
    if (nullptr == customThis && customOther)
      return false;
    if (customThis && nullptr == customOther)
      return false;
    if (customThis && customOther)
    {
      if ((*customThis) != (*customOther))
        return false;
    }
  }

  return m_background_fill_mode == other.m_background_fill_mode &&
    m_fill_rule == other.m_fill_rule &&
    m_hatch_index == other.m_hatch_index &&
    m_hatch_rotation == other.m_hatch_rotation &&
    m_background_fill_color == other.m_background_fill_color &&
    m_background_fill_print_color == other.m_background_fill_print_color &&
    m_boundary_color == other.m_boundary_color &&
    m_boundary_print_color == other.m_boundary_print_color &&
    m_hatch_color == other.m_hatch_color &&
    m_hatch_print_color == other.m_hatch_print_color &&
    m_boundary_visible == other.m_boundary_visible &&
    m_boundary_width_scale == other.m_boundary_width_scale;
}